

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ScoreList *this;
  Score *pSVar3;
  undefined4 extraout_var;
  ostream *poVar4;
  int local_154;
  undefined1 local_150 [4];
  int i;
  Score *local_130;
  Score *s;
  ScoreIterator *it;
  string local_118;
  Score *local_f8;
  Score *s5;
  string local_e8;
  Score *local_c8;
  Score *s4;
  string local_b8;
  Score *local_98;
  Score *s3;
  string local_88;
  Score *local_68;
  Score *s2;
  string local_58;
  Score *local_38;
  Score *s1;
  ScoreList *local_20;
  ScoreList *list;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  list = (ScoreList *)argv;
  argv_local._0_4_ = argc;
  this = (ScoreList *)operator_new(0x110);
  ScoreList::ScoreList(this);
  local_20 = this;
  pSVar3 = (Score *)operator_new(0x30);
  s2._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"s1",(allocator<char> *)((long)&s2 + 7));
  Score::Score(pSVar3,&local_58,10);
  s2._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s2 + 7));
  local_38 = pSVar3;
  pSVar3 = (Score *)operator_new(0x30);
  s3._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"s2",(allocator<char> *)((long)&s3 + 7));
  Score::Score(pSVar3,&local_88,0xf);
  s3._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s3 + 7));
  local_68 = pSVar3;
  pSVar3 = (Score *)operator_new(0x30);
  s4._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"s3",(allocator<char> *)((long)&s4 + 7));
  Score::Score(pSVar3,&local_b8,9);
  s4._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s4 + 7));
  local_98 = pSVar3;
  pSVar3 = (Score *)operator_new(0x30);
  s5._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e8,"s4",(allocator<char> *)((long)&s5 + 7));
  Score::Score(pSVar3,&local_e8,0);
  s5._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s5 + 7));
  local_c8 = pSVar3;
  pSVar3 = (Score *)operator_new(0x30);
  it._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_118,"s5",(allocator<char> *)((long)&it + 7));
  Score::Score(pSVar3,&local_118,0x13);
  it._6_1_ = 0;
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&it + 7));
  local_f8 = pSVar3;
  ScoreList::append(local_20,local_38);
  ScoreList::append(local_20,local_68);
  ScoreList::append(local_20,local_98);
  ScoreList::append(local_20,local_c8);
  ScoreList::append(local_20,local_f8);
  s = (Score *)ScoreList::iterator(local_20);
  (*((Iterator *)&s->_vptr_Score)->_vptr_Iterator[2])();
  do {
    iVar1 = (*s->_vptr_Score[5])();
    local_130 = (Score *)CONCAT44(extraout_var,iVar1);
    if (local_130 != (Score *)0x0) {
      Score::getName_abi_cxx11_((string *)local_150,local_130);
      poVar4 = std::operator<<((ostream *)&std::cout,(string *)local_150);
      poVar4 = std::operator<<(poVar4,":");
      iVar1 = Score::getScore(local_130);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar1);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_150);
    }
    uVar2 = (*s->_vptr_Score[4])();
  } while ((uVar2 & 1) != 0);
  for (local_154 = 0; iVar1 = ScoreList::count(local_20), local_154 < iVar1;
      local_154 = local_154 + 1) {
    pSVar3 = ScoreList::get(local_20,local_154);
    if ((pSVar3 != (Score *)0x0) &&
       (pSVar3 = ScoreList::get(local_20,local_154), pSVar3 != (Score *)0x0)) {
      (*pSVar3->_vptr_Score[1])();
    }
  }
  if (local_20 != (ScoreList *)0x0) {
    (*local_20->_vptr_ScoreList[1])();
  }
  if (s != (Score *)0x0) {
    (*s->_vptr_Score[1])();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	ScoreList* list = new ScoreList();

	Score* s1 = new Score("s1", 10);
	Score* s2 = new Score("s2", 15);
	Score* s3 = new Score("s3", 9);
	Score* s4 = new Score("s4", 0);
	Score* s5 = new Score("s5", 19);

	list->append(s1);
	list->append(s2);
	list->append(s3);
	list->append(s4);
	list->append(s5);

	ScoreIterator* it= list->iterator();

	it->first();
	do {
		Score* s = it->current();
		if (!s)
			continue;

		cout<<s->getName()<<":"<<s->getScore()<<endl;

	} while (it->next());

	for (int i = 0; i < list->count(); ++i) {
		if (list->get(i))
			delete list->get(i);
	}
	delete list;
	delete it;

	return 0;
}